

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::RE2Match(void)

{
  bool bVar1;
  long lVar2;
  int port;
  string host;
  string all;
  StringPiece group [4];
  int *local_298;
  string *local_290;
  string *local_288;
  StringPiece local_280;
  LogMessageFatal local_270;
  RE2 re;
  
  RE2::RE2(&re,"((\\w+):([0-9]+))");
  lVar2 = 0;
  do {
    *(undefined8 *)((long)&group[0].ptr_ + lVar2) = 0;
    *(undefined4 *)((long)&group[0].length_ + lVar2) = 0;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x40);
  local_280.ptr_ = "zyzzyva";
  local_280.length_ = 7;
  bVar1 = RE2::Match(&re,&local_280,0,7,UNANCHORED,group,4);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x15f);
    std::operator<<((ostream *)&local_270.super_LogMessage.str_,
                    "Check failed: !re.Match(s, 0, s.size(), RE2::UNANCHORED, group, arraysize(group))"
                   );
    LogMessageFatal::~LogMessageFatal(&local_270);
  }
  local_280.ptr_ = "a chrisr:9000 here";
  local_280.length_ = 0x12;
  bVar1 = RE2::Match(&re,&local_280,0,0x12,UNANCHORED,group,4);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x164);
    std::operator<<((ostream *)&local_270.super_LogMessage.str_,
                    "Check failed: re.Match(s, 0, s.size(), RE2::UNANCHORED, group, arraysize(group))"
                   );
    LogMessageFatal::~LogMessageFatal(&local_270);
  }
  local_270.super_LogMessage._0_8_ = "chrisr:9000";
  local_270.super_LogMessage._8_4_ = 0xb;
  bVar1 = StringPiece::_equal(group,(StringPiece *)&local_270);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x165);
    std::operator<<((ostream *)&local_270.super_LogMessage.str_,
                    "Check failed: (group[0]) == (\"chrisr:9000\")");
    LogMessageFatal::~LogMessageFatal(&local_270);
  }
  local_270.super_LogMessage._0_8_ = "chrisr:9000";
  local_270.super_LogMessage._8_4_ = 0xb;
  bVar1 = StringPiece::_equal(group + 1,(StringPiece *)&local_270);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x166);
    std::operator<<((ostream *)&local_270.super_LogMessage.str_,
                    "Check failed: (group[1]) == (\"chrisr:9000\")");
    LogMessageFatal::~LogMessageFatal(&local_270);
  }
  local_270.super_LogMessage._0_8_ = "chrisr";
  local_270.super_LogMessage._8_4_ = 6;
  bVar1 = StringPiece::_equal(group + 2,(StringPiece *)&local_270);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x167);
    std::operator<<((ostream *)&local_270.super_LogMessage.str_,
                    "Check failed: (group[2]) == (\"chrisr\")");
    LogMessageFatal::~LogMessageFatal(&local_270);
  }
  local_270.super_LogMessage._0_8_ = "9000";
  local_270.super_LogMessage._8_4_ = 4;
  bVar1 = StringPiece::_equal(group + 3,(StringPiece *)&local_270);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x168);
    std::operator<<((ostream *)&local_270.super_LogMessage.str_,
                    "Check failed: (group[3]) == (\"9000\")");
    LogMessageFatal::~LogMessageFatal(&local_270);
  }
  all._M_dataplus._M_p = (pointer)&all.field_2;
  all._M_string_length = 0;
  all.field_2._M_local_buf[0] = '\0';
  host._M_dataplus._M_p = (pointer)&host.field_2;
  host._M_string_length = 0;
  host.field_2._M_local_buf[0] = '\0';
  local_270.super_LogMessage._0_8_ = "a chrisr:9000 here";
  local_270.super_LogMessage._8_4_ = 0x12;
  local_288 = &all;
  local_290 = &host;
  local_298 = &port;
  bVar1 = RE2::PartialMatch<std::__cxx11::string*,std::__cxx11::string*,int*>
                    ((StringPiece *)&local_270,&re,&local_288,&local_290,&local_298);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x16c);
    std::operator<<((ostream *)&local_270.super_LogMessage.str_,
                    "Check failed: RE2::PartialMatch(\"a chrisr:9000 here\", re, &all, &host, &port)"
                   );
    LogMessageFatal::~LogMessageFatal(&local_270);
  }
  bVar1 = std::operator==(&all,"chrisr:9000");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x16d);
    std::operator<<((ostream *)&local_270.super_LogMessage.str_,
                    "Check failed: (all) == (\"chrisr:9000\")");
    LogMessageFatal::~LogMessageFatal(&local_270);
  }
  bVar1 = std::operator==(&host,"chrisr");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x16e);
    std::operator<<((ostream *)&local_270.super_LogMessage.str_,
                    "Check failed: (host) == (\"chrisr\")");
    LogMessageFatal::~LogMessageFatal(&local_270);
  }
  if (port != 9000) {
    LogMessageFatal::LogMessageFatal
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x16f);
    std::operator<<((ostream *)&local_270.super_LogMessage.str_,"Check failed: (port) == (9000)");
    LogMessageFatal::~LogMessageFatal(&local_270);
  }
  std::__cxx11::string::~string((string *)&host);
  std::__cxx11::string::~string((string *)&all);
  RE2::~RE2(&re);
  return;
}

Assistant:

TEST(RE2, Match) {
  RE2 re("((\\w+):([0-9]+))");   // extracts host and port
  StringPiece group[4];

  // No match.
  StringPiece s = "zyzzyva";
  CHECK(!re.Match(s, 0, s.size(), RE2::UNANCHORED,
                  group, arraysize(group)));

  // Matches and extracts.
  s = "a chrisr:9000 here";
  CHECK(re.Match(s, 0, s.size(), RE2::UNANCHORED,
                 group, arraysize(group)));
  CHECK_EQ(group[0], "chrisr:9000");
  CHECK_EQ(group[1], "chrisr:9000");
  CHECK_EQ(group[2], "chrisr");
  CHECK_EQ(group[3], "9000");

  string all, host;
  int port;
  CHECK(RE2::PartialMatch("a chrisr:9000 here", re, &all, &host, &port));
  CHECK_EQ(all, "chrisr:9000");
  CHECK_EQ(host, "chrisr");
  CHECK_EQ(port, 9000);
}